

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_cache_test.cc
# Opt level: O1

void TemplateCacheUnittest::TestRefcounting(void)

{
  char *pcVar1;
  int iVar2;
  int iVar3;
  Template *pTVar4;
  long lVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  TemplateString *this;
  Template *pTVar8;
  Strip SVar9;
  TemplateCache cache1;
  string filename1;
  string filename2;
  TemplateDictionary dict;
  undefined1 local_148 [32];
  TemplateString local_128 [2];
  long local_e8;
  string local_e0;
  string local_c0;
  TemplateDictionary local_a0 [112];
  
  ctemplate::TemplateCache::TemplateCache((TemplateCache *)local_128);
  local_148._0_8_ = "dict";
  local_148._8_8_ = 4;
  local_148[0x10] = true;
  local_148._24_8_ = 0;
  ctemplate::TemplateDictionary::TemplateDictionary
            (local_a0,(TemplateString *)local_148,(UnsafeArena *)0x0);
  pcVar1 = local_148 + 0x10;
  local_148._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_148,"{valid template}","");
  ctemplate::StringToTemplateFile(&local_e0,(string *)local_148);
  if ((char *)local_148._0_8_ != pcVar1) {
    operator_delete((void *)local_148._0_8_);
  }
  local_148._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_148,"{another valid template}","")
  ;
  ctemplate::StringToTemplateFile(&local_c0,(string *)local_148);
  if ((char *)local_148._0_8_ != pcVar1) {
    operator_delete((void *)local_148._0_8_);
  }
  local_148._0_8_ = local_e0._M_dataplus._M_p;
  local_148[0x10] = false;
  local_148._24_8_ = 0;
  SVar9 = (Strip)local_148;
  pTVar4 = (Template *)ctemplate::TemplateCache::GetTemplate(local_128,SVar9);
  if (pTVar4 == (Template *)0x0) {
    __assert_fail("cache1_tpl1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                  ,0x25c,"static void TemplateCacheUnittest::TestRefcounting()");
  }
  local_148._0_8_ = local_c0._M_dataplus._M_p;
  local_148[0x10] = false;
  local_148._24_8_ = 0;
  lVar5 = ctemplate::TemplateCache::GetTemplate(local_128,SVar9);
  if (lVar5 == 0) {
    __assert_fail("cache1_tpl2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                  ,0x25f,"static void TemplateCacheUnittest::TestRefcounting()");
  }
  local_148._8_8_ = SEXT48((int)local_e0._M_string_length);
  local_148._0_8_ = local_e0._M_dataplus._M_p;
  local_148[0x10] =
       local_e0._M_dataplus._M_p < &data_start && &UNK_0010671f < local_e0._M_dataplus._M_p;
  local_148._24_8_ = 0;
  uVar6 = ctemplate::TemplateString::GetGlobalId();
  iVar2 = ctemplate::TemplateCache::Refcount(local_128,uVar6,2);
  if (iVar2 == 2) {
    local_148._8_8_ = SEXT48((int)local_c0._M_string_length);
    local_148._0_8_ = local_c0._M_dataplus._M_p;
    local_148[0x10] =
         local_c0._M_dataplus._M_p < &data_start && &UNK_0010671f < local_c0._M_dataplus._M_p;
    local_148._24_8_ = 0;
    uVar7 = ctemplate::TemplateString::GetGlobalId();
    iVar2 = ctemplate::TemplateCache::Refcount(local_128,uVar7,2);
    if (iVar2 == 2) {
      this = (TemplateString *)ctemplate::TemplateCache::Clone();
      iVar2 = ctemplate::TemplateCache::Refcount(local_128,uVar6,2);
      if (iVar2 == 3) {
        iVar2 = ctemplate::TemplateCache::Refcount(this,uVar6,2);
        if (iVar2 == 3) {
          iVar2 = ctemplate::TemplateCache::Refcount(local_128,uVar7,2);
          if (iVar2 == 3) {
            iVar2 = ctemplate::TemplateCache::Refcount(this,uVar7,2);
            if (iVar2 == 3) {
              local_148._0_8_ = local_e0._M_dataplus._M_p;
              local_148[0x10] = false;
              local_148._24_8_ = 0;
              pTVar8 = (Template *)ctemplate::TemplateCache::GetTemplate(this,SVar9);
              local_148._8_8_ =
                   CONCAT44(local_c0._M_string_length._4_4_,(int)local_c0._M_string_length);
              local_148._0_8_ = local_c0._M_dataplus._M_p;
              local_148[0x10] = false;
              local_148._24_8_ = 0;
              local_e8 = ctemplate::TemplateCache::GetTemplate(this,SVar9);
              if (pTVar8 != pTVar4) {
                printf("ASSERT FAILED, line %d: %s\n",0x277,"cache2_tpl1 == cache1_tpl1");
                __assert_fail("cache2_tpl1 == cache1_tpl1",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                              ,0x277,"static void TemplateCacheUnittest::TestRefcounting()");
              }
              if (local_e8 != lVar5) {
                printf("ASSERT FAILED, line %d: %s\n",0x278,"cache2_tpl2 == cache1_tpl2");
                __assert_fail("cache2_tpl2 == cache1_tpl2",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                              ,0x278,"static void TemplateCacheUnittest::TestRefcounting()");
              }
              iVar2 = ctemplate::TemplateCache::Refcount(local_128,uVar6,2);
              if (iVar2 == 4) {
                iVar2 = ctemplate::TemplateCache::Refcount(this,uVar6,2);
                if (iVar2 == 4) {
                  iVar2 = ctemplate::TemplateCache::Refcount(local_128,uVar7,2);
                  if (iVar2 == 4) {
                    iVar2 = ctemplate::TemplateCache::Refcount(this,uVar7,2);
                    if (iVar2 == 4) {
                      local_148._0_8_ = local_148 + 0x10;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)local_148,"{file1 contents changed}","");
                      ctemplate::StringToFile((string *)local_148,&local_e0);
                      if ((undefined1 *)local_148._0_8_ != local_148 + 0x10) {
                        operator_delete((void *)local_148._0_8_);
                      }
                      ctemplate::TemplateCache::ReloadAllIfChanged((ReloadType)this);
                      local_148._0_8_ = local_e0._M_dataplus._M_p;
                      local_148[0x10] = false;
                      local_148._24_8_ = 0;
                      pTVar4 = (Template *)ctemplate::TemplateCache::GetTemplate(this,SVar9);
                      if (pTVar4 == pTVar8) {
                        printf("ASSERT FAILED, line %d: %s\n",0x288,
                               "cache2_tpl1_post_reload != cache2_tpl1");
                        __assert_fail("cache2_tpl1_post_reload != cache2_tpl1",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                                      ,0x288,"static void TemplateCacheUnittest::TestRefcounting()")
                        ;
                      }
                      local_148._0_8_ = local_148 + 0x10;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)local_148,"{file1 contents changed}","");
                      ctemplate::AssertExpandIs(pTVar4,local_a0,(string *)local_148,true);
                      if ((undefined1 *)local_148._0_8_ != local_148 + 0x10) {
                        operator_delete((void *)local_148._0_8_);
                      }
                      local_148._8_8_ =
                           CONCAT44(local_c0._M_string_length._4_4_,(int)local_c0._M_string_length);
                      local_148._0_8_ = local_c0._M_dataplus._M_p;
                      local_148[0x10] = false;
                      local_148._24_8_ = 0;
                      lVar5 = ctemplate::TemplateCache::GetTemplate(this,SVar9);
                      if (lVar5 != local_e8) {
                        printf("ASSERT FAILED, line %d: %s\n",0x290,
                               "cache2_tpl2_post_reload == cache2_tpl2");
                        __assert_fail("cache2_tpl2_post_reload == cache2_tpl2",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                                      ,0x290,"static void TemplateCacheUnittest::TestRefcounting()")
                        ;
                      }
                      iVar2 = ctemplate::TemplateCache::Refcount(local_128,uVar6,2);
                      if (iVar2 == 3) {
                        iVar2 = ctemplate::TemplateCache::Refcount(this,uVar6,2);
                        if (iVar2 == 2) {
                          iVar2 = ctemplate::TemplateCache::Refcount(local_128,uVar7,2);
                          if (iVar2 == 5) {
                            iVar3 = ctemplate::TemplateCache::Refcount(this,uVar7,2);
                            iVar2 = (int)ctemplate::Template::num_deletes_;
                            if (iVar3 == 5) {
                              ctemplate::TemplateCache::DoneWithGetTemplatePtrs();
                              iVar3 = ctemplate::TemplateCache::Refcount(local_128,uVar6,2);
                              if (iVar3 == 2) {
                                iVar3 = ctemplate::TemplateCache::Refcount(this,uVar6,2);
                                if (iVar3 == 1) {
                                  iVar3 = ctemplate::TemplateCache::Refcount(local_128,uVar7,2);
                                  if (iVar3 == 3) {
                                    iVar3 = ctemplate::TemplateCache::Refcount(this,uVar7,2);
                                    if (iVar3 == 3) {
                                      ctemplate::TemplateCache::ClearCache();
                                      iVar3 = iVar2 + 1;
                                      if ((int)ctemplate::Template::num_deletes_ == iVar3) {
                                        ctemplate::TemplateCache::ClearCache();
                                        iVar2 = iVar2 + 3;
                                        if ((int)ctemplate::Template::num_deletes_ == iVar2) {
                                          ctemplate::TemplateCache::~TemplateCache
                                                    ((TemplateCache *)this);
                                          operator_delete(this);
                                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                               *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
                                            operator_delete(local_c0._M_dataplus._M_p);
                                          }
                                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                               *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
                                            operator_delete(local_e0._M_dataplus._M_p);
                                          }
                                          ctemplate::TemplateDictionary::~TemplateDictionary
                                                    (local_a0);
                                          ctemplate::TemplateCache::~TemplateCache
                                                    ((TemplateCache *)local_128);
                                          return;
                                        }
                                        printf("ASSERT FAILED, line %d: %s\n",0x2b0,
                                               "cache_peer.NumTotalTemplateDeletes() == old_delete_count + 3"
                                              );
                                        if ((int)ctemplate::Template::num_deletes_ != iVar2) {
                                          __assert_fail(
                                                  "cache_peer.NumTotalTemplateDeletes() == old_delete_count + 3"
                                                  ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                                                  ,0x2b0,
                                                  "static void TemplateCacheUnittest::TestRefcounting()"
                                                  );
                                        }
                                      }
                                      else {
                                        printf("ASSERT FAILED, line %d: %s\n",0x2ad,
                                               "cache_peer.NumTotalTemplateDeletes() == old_delete_count + 1"
                                              );
                                        if ((int)ctemplate::Template::num_deletes_ != iVar3) {
                                          __assert_fail(
                                                  "cache_peer.NumTotalTemplateDeletes() == old_delete_count + 1"
                                                  ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                                                  ,0x2ad,
                                                  "static void TemplateCacheUnittest::TestRefcounting()"
                                                  );
                                        }
                                      }
                                    }
                                    else {
                                      printf("ASSERT FAILED, line %d: %s\n",0x2a8,
                                             "cache_peer2.Refcount(cache_key2) == 3");
                                      iVar2 = ctemplate::TemplateCache::Refcount(this,uVar7,2);
                                      if (iVar2 != 3) {
                                        __assert_fail("cache_peer2.Refcount(cache_key2) == 3",
                                                                                                            
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                                                  ,0x2a8,
                                                  "static void TemplateCacheUnittest::TestRefcounting()"
                                                  );
                                      }
                                    }
                                  }
                                  else {
                                    printf("ASSERT FAILED, line %d: %s\n",0x2a7,
                                           "cache_peer.Refcount(cache_key2) == 3");
                                    iVar2 = ctemplate::TemplateCache::Refcount(local_128,uVar7,2);
                                    if (iVar2 != 3) {
                                      __assert_fail("cache_peer.Refcount(cache_key2) == 3",
                                                                                                        
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                                                  ,0x2a7,
                                                  "static void TemplateCacheUnittest::TestRefcounting()"
                                                  );
                                    }
                                  }
                                }
                                else {
                                  printf("ASSERT FAILED, line %d: %s\n",0x2a6,
                                         "cache_peer2.Refcount(cache_key1) == 1");
                                  iVar2 = ctemplate::TemplateCache::Refcount(this,uVar6,2);
                                  if (iVar2 != 1) {
                                    __assert_fail("cache_peer2.Refcount(cache_key1) == 1",
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                                                  ,0x2a6,
                                                  "static void TemplateCacheUnittest::TestRefcounting()"
                                                 );
                                  }
                                }
                              }
                              else {
                                printf("ASSERT FAILED, line %d: %s\n",0x2a5,
                                       "cache_peer.Refcount(cache_key1) == 2");
                                iVar2 = ctemplate::TemplateCache::Refcount(local_128,uVar6,2);
                                if (iVar2 != 2) {
                                  __assert_fail("cache_peer.Refcount(cache_key1) == 2",
                                                "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                                                ,0x2a5,
                                                "static void TemplateCacheUnittest::TestRefcounting()"
                                               );
                                }
                              }
                            }
                            else {
                              printf("ASSERT FAILED, line %d: %s\n",0x29c,
                                     "cache_peer2.Refcount(cache_key2) == 5");
                              iVar2 = ctemplate::TemplateCache::Refcount(this,uVar7,2);
                              if (iVar2 != 5) {
                                __assert_fail("cache_peer2.Refcount(cache_key2) == 5",
                                              "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                                              ,0x29c,
                                              "static void TemplateCacheUnittest::TestRefcounting()"
                                             );
                              }
                            }
                          }
                          else {
                            printf("ASSERT FAILED, line %d: %s\n",0x29b,
                                   "cache_peer.Refcount(cache_key2) == 5");
                            iVar2 = ctemplate::TemplateCache::Refcount(local_128,uVar7,2);
                            if (iVar2 != 5) {
                              __assert_fail("cache_peer.Refcount(cache_key2) == 5",
                                            "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                                            ,0x29b,
                                            "static void TemplateCacheUnittest::TestRefcounting()");
                            }
                          }
                        }
                        else {
                          printf("ASSERT FAILED, line %d: %s\n",0x29a,
                                 "cache_peer2.Refcount(cache_key1) == 2");
                          iVar2 = ctemplate::TemplateCache::Refcount(this,uVar6,2);
                          if (iVar2 != 2) {
                            __assert_fail("cache_peer2.Refcount(cache_key1) == 2",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                                          ,0x29a,
                                          "static void TemplateCacheUnittest::TestRefcounting()");
                          }
                        }
                      }
                      else {
                        printf("ASSERT FAILED, line %d: %s\n",0x299,
                               "cache_peer.Refcount(cache_key1) == 3");
                        iVar2 = ctemplate::TemplateCache::Refcount(local_128,uVar6,2);
                        if (iVar2 != 3) {
                          __assert_fail("cache_peer.Refcount(cache_key1) == 3",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                                        ,0x299,
                                        "static void TemplateCacheUnittest::TestRefcounting()");
                        }
                      }
                    }
                    else {
                      printf("ASSERT FAILED, line %d: %s\n",0x27e,
                             "cache_peer2.Refcount(cache_key2) == 4");
                      iVar2 = ctemplate::TemplateCache::Refcount(this,uVar7,2);
                      if (iVar2 != 4) {
                        __assert_fail("cache_peer2.Refcount(cache_key2) == 4",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                                      ,0x27e,"static void TemplateCacheUnittest::TestRefcounting()")
                        ;
                      }
                    }
                  }
                  else {
                    printf("ASSERT FAILED, line %d: %s\n",0x27d,
                           "cache_peer.Refcount(cache_key2) == 4");
                    iVar2 = ctemplate::TemplateCache::Refcount(local_128,uVar7,2);
                    if (iVar2 != 4) {
                      __assert_fail("cache_peer.Refcount(cache_key2) == 4",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                                    ,0x27d,"static void TemplateCacheUnittest::TestRefcounting()");
                    }
                  }
                }
                else {
                  printf("ASSERT FAILED, line %d: %s\n",0x27c,
                         "cache_peer2.Refcount(cache_key1) == 4");
                  iVar2 = ctemplate::TemplateCache::Refcount(this,uVar6,2);
                  if (iVar2 != 4) {
                    __assert_fail("cache_peer2.Refcount(cache_key1) == 4",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                                  ,0x27c,"static void TemplateCacheUnittest::TestRefcounting()");
                  }
                }
              }
              else {
                printf("ASSERT FAILED, line %d: %s\n",0x27b,"cache_peer.Refcount(cache_key1) == 4");
                iVar2 = ctemplate::TemplateCache::Refcount(local_128,uVar6,2);
                if (iVar2 != 4) {
                  __assert_fail("cache_peer.Refcount(cache_key1) == 4",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                                ,0x27b,"static void TemplateCacheUnittest::TestRefcounting()");
                }
              }
            }
            else {
              printf("ASSERT FAILED, line %d: %s\n",0x270,"cache_peer2.Refcount(cache_key2) == 3");
              iVar2 = ctemplate::TemplateCache::Refcount(this,uVar7,2);
              if (iVar2 != 3) {
                __assert_fail("cache_peer2.Refcount(cache_key2) == 3",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                              ,0x270,"static void TemplateCacheUnittest::TestRefcounting()");
              }
            }
          }
          else {
            printf("ASSERT FAILED, line %d: %s\n",0x26f,"cache_peer.Refcount(cache_key2) == 3");
            iVar2 = ctemplate::TemplateCache::Refcount(local_128,uVar7,2);
            if (iVar2 != 3) {
              __assert_fail("cache_peer.Refcount(cache_key2) == 3",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                            ,0x26f,"static void TemplateCacheUnittest::TestRefcounting()");
            }
          }
        }
        else {
          printf("ASSERT FAILED, line %d: %s\n",0x26e,"cache_peer2.Refcount(cache_key1) == 3");
          iVar2 = ctemplate::TemplateCache::Refcount(this,uVar6,2);
          if (iVar2 != 3) {
            __assert_fail("cache_peer2.Refcount(cache_key1) == 3",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                          ,0x26e,"static void TemplateCacheUnittest::TestRefcounting()");
          }
        }
      }
      else {
        printf("ASSERT FAILED, line %d: %s\n",0x26d,"cache_peer.Refcount(cache_key1) == 3");
        iVar2 = ctemplate::TemplateCache::Refcount(local_128,uVar6,2);
        if (iVar2 != 3) {
          __assert_fail("cache_peer.Refcount(cache_key1) == 3",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                        ,0x26d,"static void TemplateCacheUnittest::TestRefcounting()");
        }
      }
    }
    else {
      printf("ASSERT FAILED, line %d: %s\n",0x266,"cache_peer.Refcount(cache_key2) == 2");
      iVar2 = ctemplate::TemplateCache::Refcount(local_128,uVar7,2);
      if (iVar2 != 2) {
        __assert_fail("cache_peer.Refcount(cache_key2) == 2",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                      ,0x266,"static void TemplateCacheUnittest::TestRefcounting()");
      }
    }
  }
  else {
    printf("ASSERT FAILED, line %d: %s\n",0x264,"cache_peer.Refcount(cache_key1) == 2");
    iVar2 = ctemplate::TemplateCache::Refcount(local_128,uVar6,2);
    if (iVar2 != 2) {
      __assert_fail("cache_peer.Refcount(cache_key1) == 2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                    ,0x264,"static void TemplateCacheUnittest::TestRefcounting()");
    }
  }
  exit(1);
}

Assistant:

static void TestRefcounting() {
    TemplateCache cache1;
    TemplateCachePeer cache_peer(&cache1);
    TemplateDictionary dict("dict");

    // Add templates
    string filename1 = StringToTemplateFile("{valid template}");
    string filename2 = StringToTemplateFile("{another valid template}");

    const Template* cache1_tpl1 = cache1.GetTemplate(filename1,
                                                     STRIP_WHITESPACE);
    assert(cache1_tpl1);
    const Template* cache1_tpl2 = cache1.GetTemplate(filename2,
                                                     STRIP_WHITESPACE);
    assert(cache1_tpl2);

    // Check refcount.  It should be 2 -- one for the originalvalue
    // when it's constructed, and one for the call to GetTemplate.
    TemplateCachePeer::TemplateCacheKey cache_key1(filename1, STRIP_WHITESPACE);
    ASSERT(cache_peer.Refcount(cache_key1) == 2);
    TemplateCachePeer::TemplateCacheKey cache_key2(filename2, STRIP_WHITESPACE);
    ASSERT(cache_peer.Refcount(cache_key2) == 2);

    // Clone cache2 from cache1
    TemplateCache* cache2 = cache1.Clone();
    TemplateCachePeer cache_peer2(cache2);

    // Check refcount was incremented.  It should be the same for both caches.
    ASSERT(cache_peer.Refcount(cache_key1) == 3);
    ASSERT(cache_peer2.Refcount(cache_key1) == 3);
    ASSERT(cache_peer.Refcount(cache_key2) == 3);
    ASSERT(cache_peer2.Refcount(cache_key2) == 3);

    // Check that the template ptrs in both caches are the same.
    const Template* cache2_tpl1 = cache2->GetTemplate(filename1,
                                                      STRIP_WHITESPACE);
    const Template* cache2_tpl2 = cache2->GetTemplate(filename2,
                                                      STRIP_WHITESPACE);
    ASSERT(cache2_tpl1 == cache1_tpl1);
    ASSERT(cache2_tpl2 == cache1_tpl2);

    // GetTemplate should have augmented the refcount.
    ASSERT(cache_peer.Refcount(cache_key1) == 4);
    ASSERT(cache_peer2.Refcount(cache_key1) == 4);
    ASSERT(cache_peer.Refcount(cache_key2) == 4);
    ASSERT(cache_peer2.Refcount(cache_key2) == 4);

    // Change tpl1 file contents and reload.
    StringToFile("{file1 contents changed}", filename1);
    cache2->ReloadAllIfChanged(TemplateCache::LAZY_RELOAD);
    // Since the template will be reloaded into a new instance,
    // GetTemplate will return new pointers. The older template
    // pointer was moved to the freelist.
    const Template* cache2_tpl1_post_reload = cache2->GetTemplate(
        filename1, STRIP_WHITESPACE);
    ASSERT(cache2_tpl1_post_reload != cache2_tpl1);
    // Check that cache1's tpl1 has the new contents
    AssertExpandIs(cache2_tpl1_post_reload, &dict, "{file1 contents changed}",
                   true);

    // Ensure tpl2 is unchanged
    const Template* cache2_tpl2_post_reload = cache2->GetTemplate(
        filename2, STRIP_WHITESPACE);
    ASSERT(cache2_tpl2_post_reload == cache2_tpl2);

    // Now key1 points to different templates in cache1 and cache2.
    // cache1's version should have a refcount of 3 (was 4, went down
    // by 1 when cache2 dropped its reference to it).  cache2's
    // version should be 2 (one for the new file, 1 for the call to
    // GetTemplate() that followed it), while key2 should have a
    // refcount of 5 in both caches (due to the new call, above, to
    // GetTemplate()).
    ASSERT(cache_peer.Refcount(cache_key1) == 3);
    ASSERT(cache_peer2.Refcount(cache_key1) == 2);
    ASSERT(cache_peer.Refcount(cache_key2) == 5);
    ASSERT(cache_peer2.Refcount(cache_key2) == 5);

    const int old_delete_count = cache_peer.NumTotalTemplateDeletes();

    // Clear up the cache2's freelist, this should drop all refcounts,
    // due to the calls cache_peer2 made to
    // GetTemplate(the-old-filename1), GetTemplate(the-new-filename1),
    // and GetTemplate(filename2) (twice!)
    cache_peer2.DoneWithGetTemplatePtrs();
    ASSERT(cache_peer.Refcount(cache_key1) == 2);
    ASSERT(cache_peer2.Refcount(cache_key1) == 1);
    ASSERT(cache_peer.Refcount(cache_key2) == 3);
    ASSERT(cache_peer2.Refcount(cache_key2) == 3);

    // Make sure that deleting from the cache causes deletion.
    // ClearCache() on peer1 should finally get rid of the old filename1.
    cache_peer.ClearCache();
    ASSERT(cache_peer.NumTotalTemplateDeletes() == old_delete_count + 1);
    cache_peer2.ClearCache();
    // Delete-count should go up by 2 as both the new tpl1, and tpl2, go away.
    ASSERT(cache_peer.NumTotalTemplateDeletes() == old_delete_count + 3);

    delete cache2;
  }